

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralMember::~IfcStructuralMember(IfcStructuralMember *this)

{
  ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL> *pOVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  
  *(undefined8 *)&this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x28 =
       0x849370;
  *(undefined8 *)&(this->super_IfcStructuralItem).super_IfcProduct.super_IfcObject.field_0x10 =
       0x8493e8;
  *(undefined8 *)
   &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x18 = 0x849398;
  *(undefined8 *)&this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0xc0 =
       0x8493c0;
  puVar3 = *(undefined1 **)
            &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0xd0;
  puVar2 = &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0xe0;
  if (puVar3 != puVar2) {
    operator_delete(puVar3,*(long *)puVar2 + 1);
  }
  *(undefined8 *)&this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x28 =
       0x849488;
  *(undefined8 *)&(this->super_IfcStructuralItem).super_IfcProduct.super_IfcObject.field_0x10 =
       0x8494b0;
  puVar2 = *(undefined1 **)
            &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x88;
  pOVar1 = &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>;
  if ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL> *)puVar2 != pOVar1) {
    operator_delete(puVar2,(long)pOVar1->_vptr_ObjectHelper + 1);
  }
  puVar3 = *(undefined1 **)
            &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x60;
  puVar2 = &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x70;
  if (puVar3 != puVar2) {
    operator_delete(puVar3,*(long *)puVar2 + 1);
  }
  puVar2 = *(undefined1 **)
            &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x38;
  puVar3 = &this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x48;
  if (puVar2 != puVar3) {
    operator_delete(puVar2,*(long *)puVar3 + 1);
  }
  operator_delete(&this[-1].super_IfcStructuralItem.super_IfcProduct.super_IfcObject.field_0x28,
                  0x138);
  return;
}

Assistant:

IfcStructuralMember() : Object("IfcStructuralMember") {}